

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O0

int MPIX_skewed_kdtree_cart_create
              (MPI_Comm old_comm,int *dims,int num_dims,int *stencil,int stencil_size,int *periods,
              MPI_Comm *cart_comm)

{
  int iVar1;
  int *dims_00;
  void *__dest;
  int *in_RCX;
  int in_EDX;
  void *in_RSI;
  MPI_Comm in_RDI;
  int in_R8D;
  int err;
  MPI_Comm tmp;
  int i;
  int new_rank;
  int *dims_heper;
  int *coordinate;
  int world_rank;
  int world_size;
  int *factors;
  MPI_Comm sorted_comm;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int *in_stack_ffffffffffffff98;
  int local_60;
  int in_stack_ffffffffffffffa4;
  undefined1 local_48 [4];
  undefined1 local_44 [4];
  int *local_40;
  MPI_Comm local_38 [2];
  int local_24;
  int *local_20;
  int local_14;
  void *local_10;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  mpireorderinglib::MPIX_Node_comm(in_RDI,local_38,(int *)0x0,(int *)0x0,NODES_MEAN);
  local_40 = (int *)malloc((long)local_14 << 3);
  MPI_Comm_size(local_38[0],local_44);
  MPI_Comm_rank(local_38[0],local_48);
  dims_00 = (int *)calloc((long)local_14,4);
  __dest = malloc((long)local_14 << 2);
  memcpy(__dest,local_10,(long)local_14 << 2);
  calculate_factors(local_40,local_14,local_20,local_24);
  skewed_find_node_recursive
            (dims_00,(int)((ulong)__dest >> 0x20),(int)__dest,in_stack_ffffffffffffffa4,
             in_stack_ffffffffffffff98,
             (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  iVar1 = *dims_00;
  for (local_60 = 1; local_60 < local_14; local_60 = local_60 + 1) {
    iVar1 = iVar1 * *(int *)((long)local_10 + (long)local_60 * 4) + dims_00[local_60];
  }
  MPI_Comm_split(local_38[0],0,iVar1,&stack0xffffffffffffff98);
  iVar1 = MPI_Cart_create((MPI_Comm)periods,sorted_comm._4_4_,factors,_world_rank,coordinate._4_4_,
                          (MPI_Comm *)dims_heper);
  MPI_Comm_free(&stack0xffffffffffffff98);
  MPI_Comm_free(local_38);
  free(local_40);
  free(__dest);
  free(dims_00);
  return iVar1;
}

Assistant:

int
MPIX_skewed_kdtree_cart_create(MPI_Comm old_comm, const int *dims, int num_dims, const int *stencil, int stencil_size,
                               const int * const periods, MPI_Comm *cart_comm) {
    MPI_Comm sorted_comm;
    mpireorderinglib::MPIX_Node_comm(old_comm, &sorted_comm);
    int *factors = static_cast<int *>(malloc(num_dims * sizeof(double)));
    int world_size;
    MPI_Comm_size(sorted_comm, &world_size);
    int world_rank;
    MPI_Comm_rank(sorted_comm, &world_rank);

    int *coordinate = static_cast<int *>(calloc(num_dims, sizeof(int)));
    int *dims_heper = static_cast<int *>(malloc(num_dims * sizeof(int)));
    memcpy(dims_heper, dims, num_dims * sizeof(int));

    // calculating these factors is only used in the skewed kd-tree variant
    calculate_factors(factors, num_dims, stencil, stencil_size);
    // actual coordinate calculation
    skewed_find_node_recursive(dims_heper, num_dims, world_size, world_rank, coordinate, factors);

    int new_rank = coordinate[0];
    for (int i = 1; i < num_dims; i++) {
        new_rank = new_rank * dims[i] + coordinate[i];
    }

    MPI_Comm tmp;
    MPI_Comm_split(sorted_comm, 0, new_rank, &tmp);
    int err = MPI_Cart_create(tmp, num_dims, dims, periods, 0, cart_comm);
    MPI_Comm_free(&tmp);
    MPI_Comm_free(&sorted_comm);
    free(factors);
    free(dims_heper);
    free(coordinate);
    return err;
}